

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_test.cc
# Opt level: O0

btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>
 __thiscall
phmap::priv::
base_checker<phmap::btree_map<int,int,phmap::Less<int>,std::allocator<std::pair<int_const,int>>>,std::map<int,int,std::less<int>,std::allocator<std::pair<int_const,int>>>>
::
iter_check<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,int,phmap::Less<int>,std::allocator<std::pair<int_const,int>>,256,false>>,std::pair<int_const,int>&,std::pair<int_const,int>*>,std::_Rb_tree_iterator<std::pair<int_const,int>>>
          (base_checker<phmap::btree_map<int,int,phmap::Less<int>,std::allocator<std::pair<int_const,int>>>,std::map<int,int,std::less<int>,std::allocator<std::pair<int_const,int>>>>
           *this,btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>
                 tree_iter,_Rb_tree_iterator<std::pair<const_int,_int>_> checker_iter)

{
  bool bVar1;
  reference x;
  reference y;
  const_iterator cVar2;
  btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>
  bVar3;
  _Self local_68;
  _Rb_tree_const_iterator<std::pair<const_int,_int>_> local_60;
  btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
  *local_58;
  int local_50;
  const_iterator local_48;
  base_checker<phmap::btree_map<int,int,phmap::Less<int>,std::allocator<std::pair<int_const,int>>>,std::map<int,int,std::less<int>,std::allocator<std::pair<int_const,int>>>>
  *local_38;
  base_checker<phmap::btree_map<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>_>
  *this_local;
  _Rb_tree_iterator<std::pair<const_int,_int>_> checker_iter_local;
  btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>
  tree_iter_local;
  
  checker_iter_local._M_node = (_Base_ptr)tree_iter.node;
  bVar3.position = tree_iter.position;
  local_38 = this;
  this_local = (base_checker<phmap::btree_map<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>_>
                *)checker_iter._M_node;
  cVar2 = btree_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
          ::end((btree_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
                 *)this);
  local_58 = cVar2.node;
  local_50 = cVar2.position;
  local_48.node = local_58;
  local_48.position = local_50;
  bVar1 = btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>
          ::operator==((btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>
                        *)&checker_iter_local,&local_48);
  if (bVar1) {
    std::_Rb_tree_const_iterator<std::pair<const_int,_int>_>::_Rb_tree_const_iterator
              (&local_60,(iterator *)&this_local);
    local_68._M_node =
         (_Base_ptr)
         std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::end
                   ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                    (this + 0x20));
    bVar1 = std::operator==(&local_60,&local_68);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                    ,0x7d,
                    "IterType phmap::priv::base_checker<phmap::btree_map<int, int>, std::map<int, int>>::iter_check(IterType, CheckerIterType) const [TreeType = phmap::btree_map<int, int>, CheckerType = std::map<int, int>, IterType = phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int, int, phmap::Less<int>, std::allocator<std::pair<const int, int>>, 256, false>>, std::pair<const int, int> &, std::pair<const int, int> *>, CheckerIterType = std::_Rb_tree_iterator<std::pair<const int, int>>]"
                   );
    }
  }
  else {
    x = btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>
        ::operator*((btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>
                     *)&checker_iter_local);
    y = std::_Rb_tree_iterator<std::pair<const_int,_int>_>::operator*
                  ((_Rb_tree_iterator<std::pair<const_int,_int>_> *)&this_local);
    (anonymous_namespace)::CheckPairEquals<int_const,int,int_const,int>(x,y);
  }
  bVar3.node = (btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                *)checker_iter_local._M_node;
  bVar3._12_4_ = 0;
  return bVar3;
}

Assistant:

IterType iter_check(IterType tree_iter, CheckerIterType checker_iter) const {
        if (tree_iter == tree_.end()) {
            PHMAP_INTERNAL_CHECK(checker_iter == checker_.end(),
                                 "Checker iterator not at end.");
        } else {
            CheckPairEquals(*tree_iter, *checker_iter);
        }
        return tree_iter;
    }